

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty
          (FBXExportProperty *this,vector<double,_std::allocator<double>_> *va)

{
  pointer puVar1;
  pointer pdVar2;
  size_t i;
  ulong uVar3;
  allocator_type local_11;
  
  this->type = 'd';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->data,
             (long)(va->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(va->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start,&local_11);
  puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar3 = 0;
      pdVar2 = (va->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(va->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3);
      uVar3 = uVar3 + 1) {
    *(double *)(puVar1 + uVar3 * 8) = pdVar2[uVar3];
  }
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const std::vector<double>& va)
: type('d')
, data(8 * va.size()) {
    double* d = reinterpret_cast<double*>(data.data());
    for (size_t i = 0; i < va.size(); ++i) {
        d[i] = va[i];
    }
}